

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O1

double __thiscall vec<3UL,_double>::operator[](vec<3UL,_double> *this,size_t i)

{
  if (i < 3) {
    if (i != 0) {
      if (i == 1) {
        this = (vec<3UL,_double> *)&this->y;
      }
      else {
        this = (vec<3UL,_double> *)&this->z;
      }
    }
    return this->x;
  }
  __assert_fail("i >= 0 && i < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                ,0x91,"T vec<3>::operator[](const size_t) const [n = 3, T = double]");
}

Assistant:

T operator[](const size_t i) const
    {
        assert(i >= 0 && i < 3);
        return i == 0 ? x : (1 == i ? y : z);
    }